

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_buffer.cpp
# Opt level: O0

void __thiscall
duckdb::VectorArrayBuffer::VectorArrayBuffer
          (VectorArrayBuffer *this,
          unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *child_vector,
          idx_t array_size,idx_t initial_capacity)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  VectorBuffer *in_RSI;
  undefined8 *in_RDI;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *in_stack_ffffffffffffffc8;
  
  VectorBuffer::VectorBuffer(in_RSI,(VectorBufferType)((ulong)in_RDX >> 0x38));
  *in_RDI = &PTR__VectorArrayBuffer_05ce9aa8;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::unique_ptr
            ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)in_RSI,
             in_stack_ffffffffffffffc8);
  in_RDI[7] = in_RDX;
  in_RDI[8] = in_RCX;
  return;
}

Assistant:

VectorArrayBuffer::VectorArrayBuffer(unique_ptr<Vector> child_vector, idx_t array_size, idx_t initial_capacity)
    : VectorBuffer(VectorBufferType::ARRAY_BUFFER), child(std::move(child_vector)), array_size(array_size),
      size(initial_capacity) {
	D_ASSERT(array_size != 0);
}